

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<capnp::Orphan<capnp::Text>_>::setCapacity
          (Vector<capnp::Orphan<capnp::Text>_> *this,size_t newSize)

{
  __off_t in_RDX;
  ArrayBuilder<capnp::Orphan<capnp::Text>_> newBuilder;
  ArrayBuilder<capnp::Orphan<capnp::Text>_> local_30;
  
  if (newSize < (ulong)((long)(this->builder).pos - (long)(this->builder).ptr >> 5)) {
    ArrayBuilder<capnp::Orphan<capnp::Text>_>::truncate(&this->builder,(char *)newSize,in_RDX);
  }
  local_30.ptr = _::HeapArrayDisposer::allocateUninitialized<capnp::Orphan<capnp::Text>>(newSize);
  local_30.endPtr = local_30.ptr + newSize;
  local_30.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_30.pos = local_30.ptr;
  ArrayBuilder<capnp::Orphan<capnp::Text>>::addAll<kj::ArrayBuilder<capnp::Orphan<capnp::Text>>>
            ((ArrayBuilder<capnp::Orphan<capnp::Text>> *)&local_30,&this->builder);
  ArrayBuilder<capnp::Orphan<capnp::Text>_>::operator=(&this->builder,&local_30);
  ArrayBuilder<capnp::Orphan<capnp::Text>_>::dispose(&local_30);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }